

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputNewDefinition_abi_cxx11_(Node *this)

{
  int iVar1;
  char *__nptr;
  int *in_RSI;
  undefined1 local_298 [64];
  undefined1 local_258 [32];
  undefined1 local_238 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  char local_1d8 [8];
  char buffer [16];
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  undefined1 local_100 [64];
  undefined1 local_c0 [56];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [35];
  undefined1 local_25;
  int local_24;
  VariableStruct *pVStack_20;
  int IsFunction;
  VariableStruct *ThisVar;
  Node *this_local;
  string *result;
  
  local_24 = 0;
  local_25 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  iVar1 = *in_RSI;
  if (iVar1 - 0x125U < 2) {
    local_24 = 1;
    std::__cxx11::string::operator+=((string *)this,"auto ");
  }
  else if (iVar1 == 0x143) {
    local_24 = 1;
    OutputNodeVarType_abi_cxx11_((Node *)local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_100 + 0x20),local_100);
    std::__cxx11::string::operator=((string *)this,(string *)(local_100 + 0x20));
    std::__cxx11::string::~string((string *)(local_100 + 0x20));
    std::__cxx11::string::~string((string *)local_100);
  }
  else if (iVar1 == 0x14e) {
    local_24 = 1;
    std::__cxx11::string::operator=((string *)this,"void ");
  }
  else if ((iVar1 == 0x17c) || (iVar1 == 0x1a1)) {
    local_24 = 1;
    std::__cxx11::string::operator=((string *)this,"void ");
  }
  else if (iVar1 == 0x1fd) {
    local_24 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"extern ",(allocator *)(local_c0 + 0x37));
    OutputNodeVarType_abi_cxx11_((Node *)local_c0);
    std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88);
    std::operator+(local_48,(char *)local_68);
    std::__cxx11::string::operator=((string *)this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x37));
  }
  else if (iVar1 == 0x1fe) {
    local_24 = 1;
    std::__cxx11::string::operator=((string *)this,"extern void ");
  }
  else if (iVar1 == 0x1ff) {
    OutputNodeVarType_abi_cxx11_((Node *)local_160);
    std::operator+(local_160 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "extern const ");
    std::operator+(local_120,local_160 + 0x20);
    std::__cxx11::string::operator=((string *)this,(string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)(local_160 + 0x20));
    std::__cxx11::string::~string((string *)local_160);
  }
  pVStack_20 = VariableList::Lookup
                         (Variables,(string *)(*(long *)(in_RSI + 0xc) + 8),
                          *(Node **)(in_RSI + 0x10),0);
  if (pVStack_20 == (VariableStruct *)0x0) {
    std::operator+((char *)local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14c0b1);
    std::operator+(local_1a0,(char *)local_1c0);
    std::__cxx11::string::operator+=((string *)this,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string(local_1c0);
  }
  else {
    VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_180,(int)pVStack_20);
    std::__cxx11::string::operator+=((string *)this,(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
  }
  if (*in_RSI == 0x125 || *in_RSI == 0x126) {
    std::__cxx11::string::operator+=((string *)this," = [&]");
  }
  if (*(long *)(in_RSI + 0x10) == 0) {
    if (local_24 != 0) {
      std::__cxx11::string::operator+=((string *)this,"(void)");
    }
  }
  else if (local_24 == 0) {
    if (*(long *)(in_RSI + 0x10) != 0) {
      iVar1 = IsSimpleInteger(*(Node **)(in_RSI + 0x10));
      if (iVar1 == 0) {
        OutputForcedType_abi_cxx11_((Node *)local_238,(VARTYPE)*(undefined8 *)(in_RSI + 0x10));
        std::operator+(local_238 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14bb52
                      );
        std::operator+(local_1f8,local_238 + 0x20);
        std::__cxx11::string::operator+=((string *)this,(string *)local_1f8);
        std::__cxx11::string::~string((string *)local_1f8);
        std::__cxx11::string::~string((string *)(local_238 + 0x20));
        std::__cxx11::string::~string((string *)local_238);
      }
      else {
        __nptr = (char *)std::__cxx11::string::c_str();
        iVar1 = atoi(__nptr);
        sprintf(local_1d8,"[%d]",(ulong)(iVar1 + 1));
        std::__cxx11::string::operator+=((string *)this,local_1d8);
      }
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)this,"(");
    if (*(long *)(in_RSI + 0x10) == 0) {
      std::__cxx11::string::operator+=((string *)this,"...");
    }
    else {
      OutputDefinitionParams_abi_cxx11_((Node *)local_258,*(Node **)(in_RSI + 0x10),0,0x1f5);
      std::__cxx11::string::operator+=((string *)this,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
    }
    std::__cxx11::string::operator+=((string *)this,")");
  }
  if (*(long *)(in_RSI + 0x12) != 0) {
    Expression_abi_cxx11_((Node *)local_298);
    std::operator+(local_298 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b4e9);
    std::__cxx11::string::operator+=((string *)this,(string *)(local_298 + 0x20));
    std::__cxx11::string::~string((string *)(local_298 + 0x20));
    std::__cxx11::string::~string((string *)local_298);
  }
  return this;
}

Assistant:

std::string Node::OutputNewDefinition(void)
{
	VariableStruct *ThisVar;
	int IsFunction = 0;
	std::string result;

	//
	// Handle class and type
	//
	switch(Type)
	{
	case BAS_N_EXTERNALFUNCTION:
		IsFunction = 1;
		result = std::string("extern ") + Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_N_EXTERNALSUB:
		IsFunction = 1;
		result = "extern void ";
		break;

	case BAS_S_FUNCTION:
		IsFunction = 1;
		result = Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		IsFunction = 1;
		result += "auto ";
		break;

	case BAS_N_EXTERNALCONSTANT:
		result = "extern const " + Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_S_SUB:
	case BAS_S_PROGRAM:
		IsFunction = 1;
		result = "void ";
		break;

	case BAS_S_HANDLER:
		IsFunction = 1;
		result = "void ";
		break;
	}

	//
	// Look for variable in table
	//
	ThisVar = Variables->Lookup(Tree[1]->TextValue, Tree[3]);

	//
	// Make up a good name to print for this variable/function
	//
	if (ThisVar != 0)
	{
		result += ThisVar->GetName();
	}
	else
	{
		result += "?" + Tree[1]->TextValue + "?";
	}

	//
	// Lambda function for DEF
	//
	switch(Type)
	{
	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		result += " = [&]";
		break;
	}

	if (Tree[3] != 0)
	{
		if (IsFunction == 0)
		{
			//
			// Handle references (Function or array)
			// (May need to be modified from x[a,b]
			// to x[a][b] manually.
			//
			if (Tree[3] != 0)
			{
				if (Tree[3]->IsSimpleInteger())
				{
					// FIXME: Isn't there a better way?
					char buffer[16];
					sprintf(buffer, "[%d]",
						(atoi(Tree[3]->TextValue.c_str()) + 1));
					result += buffer;
				}
				else
				{
					result += "[" +
						Tree[3]->OutputForcedType(VARTYPE_INTEGER) + " + 1]";
				}
			}
		}
		else
		{
			//
			// Handle references (Function)
			//
			result += "(";

			if (Tree[3] != 0)
			{
				result += Tree[3]->OutputDefinitionParams(0, BAS_N_LIST);
			}
			else
			{
				result += "...";
			}

			result += ")";
		}
	}
	else
	{
		if (IsFunction != 0)
		{
			result += "(void)";
		}
	}

	//
	// Output any constant definitions
	//
	if (Tree[4] != 0)
	{
		result += " = " + Tree[4]->Expression();
	}

	return result;
}